

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O2

wchar_t mapglyph(nh_dbuf_entry_conflict *dbe,curses_symdef_conflict *syms,wchar_t *bg_color)

{
  curses_symdef_conflict *pcVar1;
  curses_symdef_conflict *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  curses_drawing_info *pcVar5;
  uint uVar6;
  wchar_t wVar7;
  curses_symdef_conflict *pcVar8;
  short sVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  wchar_t wVar13;
  ushort uVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int iVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  
  pcVar5 = cur_drawing;
  wVar7 = dbe->effect;
  if (wVar7 == L'\0') {
    if (dbe->invis == '\0') {
      wVar7 = (wchar_t)dbe->mon;
      if (dbe->mon != 0) {
        if ((cur_drawing->num_monsters < wVar7) && ((dbe->monflags & 8) != 0)) {
          pcVar8 = cur_drawing->warnings + (~cur_drawing->num_monsters + wVar7);
        }
        else {
          pcVar8 = cur_drawing->monsters + (long)wVar7 + -1;
        }
        *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar8->unichar + 5);
        uVar16 = *(undefined4 *)&pcVar8->symname;
        uVar17 = *(undefined4 *)((long)&pcVar8->symname + 4);
        iVar18 = pcVar8->color;
        wVar7 = pcVar8->unichar[0];
        wVar13 = pcVar8->unichar[1];
        wVar19 = pcVar8->unichar[2];
        wVar20 = pcVar8->unichar[3];
        wVar21 = pcVar8->unichar[4];
        goto LAB_001123d0;
      }
      uVar11 = 0;
    }
    else {
      pcVar8 = cur_drawing->invis;
      *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar8->unichar + 5);
      uVar16 = *(undefined4 *)&pcVar8->symname;
      uVar17 = *(undefined4 *)((long)&pcVar8->symname + 4);
      iVar18 = pcVar8->color;
      wVar7 = pcVar8->unichar[0];
      wVar13 = pcVar8->unichar[1];
      wVar19 = pcVar8->unichar[2];
      wVar20 = pcVar8->unichar[3];
      wVar21 = pcVar8->unichar[4];
LAB_001123d0:
      syms->unichar[1] = wVar13;
      syms->unichar[2] = wVar19;
      syms->unichar[3] = wVar20;
      syms->unichar[4] = wVar21;
      *(undefined4 *)&syms->symname = uVar16;
      *(undefined4 *)((long)&syms->symname + 4) = uVar17;
      syms->color = iVar18;
      syms->unichar[0] = wVar7;
      valley_symdef(syms);
      uVar11 = 1;
    }
    if (dbe->obj != 0) {
      pcVar8 = syms + uVar11;
      object_symdef(dbe->obj + L'\xffffffff',dbe->obj_mn + L'\xffffffff',pcVar8);
      if ((dbe->objflags & 2) != 0) {
        pcVar8->color = 0xd;
      }
      valley_symdef(pcVar8);
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
        darken_symdef(pcVar8);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    }
    if ((long)dbe->trap == 0) {
      if ((int)uVar11 != 0) goto LAB_001124cb;
      sVar9 = dbe->bg;
      uVar11 = 0;
    }
    else {
      lVar15 = (long)dbe->trap + -1;
      pcVar1 = cur_drawing->traps;
      *(undefined8 *)(syms[uVar11].unichar + 5) = *(undefined8 *)(pcVar1[lVar15].unichar + 5);
      pcVar8 = pcVar1 + lVar15;
      pcVar3 = pcVar8->symname;
      iVar18 = pcVar8->color;
      wVar7 = pcVar8->unichar[0];
      uVar4 = *(undefined8 *)(pcVar1[lVar15].unichar + 1 + 2);
      *(undefined8 *)(syms[uVar11].unichar + 1) = *(undefined8 *)(pcVar1[lVar15].unichar + 1);
      *(undefined8 *)(syms[uVar11].unichar + 1 + 2) = uVar4;
      pcVar8 = syms + uVar11;
      pcVar8->symname = pcVar3;
      pcVar8->color = iVar18;
      pcVar8->unichar[0] = wVar7;
      valley_symdef(syms + uVar11);
      if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
        darken_symdef(syms + uVar11);
      }
      if (((wchar_t)lVar15 == mportal_id) || ((wchar_t)lVar15 == vibsquare_id)) {
        *bg_color = L'\x01';
      }
      uVar11 = (ulong)((int)uVar11 + 1);
LAB_001124cb:
      wVar13 = (wchar_t)uVar11;
      sVar9 = dbe->bg;
      wVar7 = (wchar_t)sVar9;
      if (wVar7 < cur_drawing->bg_feature_offset) goto LAB_001126e9;
    }
    pcVar8 = syms + uVar11;
    pcVar2 = cur_drawing->bgelements;
    *(undefined8 *)(syms[uVar11].unichar + 5) = *(undefined8 *)(pcVar2[sVar9].unichar + 5);
    pcVar1 = pcVar2 + sVar9;
    pcVar3 = pcVar1->symname;
    iVar18 = pcVar1->color;
    wVar7 = pcVar1->unichar[0];
    uVar4 = *(undefined8 *)(pcVar2[sVar9].unichar + 1 + 2);
    *(undefined8 *)(syms[uVar11].unichar + 1) = *(undefined8 *)(pcVar2[sVar9].unichar + 1);
    *(undefined8 *)(syms[uVar11].unichar + 1 + 2) = uVar4;
    pcVar1 = syms + uVar11;
    pcVar1->symname = pcVar3;
    pcVar1->color = iVar18;
    wVar13 = level_display_mode;
    pcVar1->unichar[0] = wVar7;
    if (settings.mapcolors != '\0') {
      wVar7 = (wchar_t)dbe->bg;
      switch(level_display_mode) {
      case L'\x01':
        if ((vwall_id <= wVar7) && (wVar7 <= trwall_id)) {
          iVar18 = 9;
          goto LAB_001125be;
        }
        break;
      case L'\x03':
        if (((vwall_id <= wVar7) && (wVar7 <= trwall_id)) && ((dbe->dgnflags & 0x1f80U) == 0)) {
          iVar18 = 3;
          goto LAB_001125be;
        }
        break;
      case L'\x04':
        if ((vwall_id <= wVar7) && (wVar7 <= trwall_id)) {
          iVar18 = 0xc;
          goto LAB_001125be;
        }
        break;
      case L'\a':
        if (room_id == wVar7) {
          iVar18 = 10;
        }
        else {
          if (darkroom_id != wVar7) break;
          iVar18 = 2;
        }
LAB_001125be:
        pcVar8->color = iVar18;
      }
      uVar12 = dbe->dgnflags;
      uVar14 = uVar12 & 0x1f80;
      if (uVar14 == 0x200) {
        if ((wVar7 < vwall_id) || (trwall_id < wVar7)) goto LAB_00112679;
        iVar18 = 0xd;
LAB_00112674:
        pcVar8->color = iVar18;
      }
      else {
        if (uVar14 == 0x100) {
          iVar18 = 10;
          if (((wVar7 < vwall_id || trwall_id < wVar7) && (room_id != wVar7)) && (ndoor_id != wVar7)
             ) {
            if (darkroom_id != wVar7) goto LAB_00112679;
            iVar18 = 2;
          }
          goto LAB_00112674;
        }
        if (uVar14 == 0x80) {
          iVar18 = 0xb;
          if (((wVar7 < vwall_id || trwall_id < wVar7) && (room_id != wVar7)) && (ndoor_id != wVar7)
             ) {
            if (darkroom_id != wVar7) goto LAB_00112679;
            iVar18 = 3;
          }
          goto LAB_00112674;
        }
      }
LAB_00112679:
      if ((vcdoor_id == wVar7) || (hcdoor_id == wVar7)) {
        if ((uVar12 & 0x10) == 0) {
          if ((uVar12 & 4) == 0) {
            if ((uVar12 & 2) == 0) goto LAB_001126a8;
            iVar18 = 2;
          }
          else {
            iVar18 = 1;
          }
        }
        else {
          iVar18 = 6;
        }
        pcVar8->color = iVar18;
      }
LAB_001126a8:
      if (altar_id == wVar7) {
        if (wVar13 == L'\x06') {
          iVar18 = 0xd;
        }
        else {
          switch(uVar12 & 0x60) {
          case 0:
            iVar18 = 1;
            break;
          case 0x20:
            iVar18 = 0xf;
            break;
          case 0x40:
            iVar18 = 7;
            break;
          case 0x60:
            iVar18 = 10;
            if ((uVar12 & 0x60) == 0x60) {
              iVar18 = 0;
            }
          }
        }
        pcVar8->color = iVar18;
      }
    }
    valley_symdef(pcVar8);
    if ((settings.darkroom != '\0') && ((dbe->dgnflags & 1) == 0)) {
      darken_symdef(pcVar8);
    }
    wVar13 = (int)uVar11 + L'\x01';
    wVar7 = (wchar_t)dbe->bg;
LAB_001126e9:
    if (((((upstair_id == wVar7) || (dnstair_id == wVar7)) || (upladder_id == wVar7)) ||
        ((dnladder_id == wVar7 || (upsstair_id == wVar7)))) || (dnsstair_id == wVar7)) {
      *bg_color = L'\x01';
    }
    if ((dbe->mon == 0) && (dbe->invis == '\0')) {
      return wVar13;
    }
    *bg_color = L'\0';
    return wVar13;
  }
  if (4 < (uint)(wVar7 >> 0x10)) goto LAB_0011239e;
  uVar6 = wVar7 + L'\xffff';
  uVar10 = uVar6 & 0xffff;
  switch(wVar7 >> 0x10) {
  case L'\0':
    pcVar1 = cur_drawing->explsyms;
    uVar12 = (ushort)((uVar6 & 0xffff) % 9);
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar1[uVar12].unichar + 5);
    pcVar8 = pcVar1 + uVar12;
    pcVar3 = pcVar8->symname;
    iVar18 = pcVar8->color;
    wVar7 = pcVar8->unichar[0];
    uVar4 = *(undefined8 *)(pcVar1[uVar12].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar1[uVar12].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar4;
    syms->symname = pcVar3;
    syms->color = iVar18;
    syms->unichar[0] = wVar7;
    pcVar8 = pcVar5->expltypes + (ushort)((uVar6 & 0xffff) / 9);
    goto LAB_00112398;
  case L'\x01':
    pcVar1 = cur_drawing->swallowsyms;
    uVar6 = uVar6 & 7;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar1[uVar6].unichar + 5);
    pcVar8 = pcVar1 + uVar6;
    pcVar3 = pcVar8->symname;
    iVar18 = pcVar8->color;
    wVar7 = pcVar8->unichar[0];
    uVar4 = *(undefined8 *)(pcVar1[uVar6].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar1[uVar6].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar4;
    syms->symname = pcVar3;
    syms->color = iVar18;
    syms->unichar[0] = wVar7;
    pcVar8 = pcVar5->monsters;
    uVar10 = uVar10 >> 3;
    goto LAB_0011238d;
  case L'\x02':
    pcVar8 = cur_drawing->zapsyms;
    break;
  case L'\x03':
    pcVar8 = cur_drawing->breathsyms;
    break;
  case L'\x04':
    pcVar1 = cur_drawing->effects;
    uVar11 = (ulong)uVar10;
    *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar1[uVar11].unichar + 5);
    pcVar8 = pcVar1 + uVar11;
    pcVar3 = pcVar8->symname;
    iVar18 = pcVar8->color;
    wVar7 = pcVar8->unichar[0];
    uVar4 = *(undefined8 *)(pcVar1[uVar11].unichar + 1 + 2);
    *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar1[uVar11].unichar + 1);
    *(undefined8 *)(syms->unichar + 3) = uVar4;
    syms->symname = pcVar3;
    syms->color = iVar18;
    syms->unichar[0] = wVar7;
    pcVar8 = pcVar5->effects;
    goto LAB_00112391;
  }
  uVar6 = uVar6 & 3;
  *(undefined8 *)(syms->unichar + 5) = *(undefined8 *)(pcVar8[uVar6].unichar + 5);
  pcVar1 = pcVar8 + uVar6;
  pcVar3 = pcVar1->symname;
  iVar18 = pcVar1->color;
  wVar7 = pcVar1->unichar[0];
  uVar4 = *(undefined8 *)(pcVar8[uVar6].unichar + 1 + 2);
  *(undefined8 *)(syms->unichar + 1) = *(undefined8 *)(pcVar8[uVar6].unichar + 1);
  *(undefined8 *)(syms->unichar + 3) = uVar4;
  syms->symname = pcVar3;
  syms->color = iVar18;
  syms->unichar[0] = wVar7;
  pcVar8 = pcVar5->zaptypes;
  uVar10 = uVar10 >> 2;
LAB_0011238d:
  uVar11 = (ulong)uVar10;
LAB_00112391:
  pcVar8 = pcVar8 + uVar11;
LAB_00112398:
  syms->color = pcVar8->color;
LAB_0011239e:
  valley_symdef(syms);
  return L'\x01';
}

Assistant:

int mapglyph(struct nh_dbuf_entry *dbe, struct curses_symdef *syms, int *bg_color)
{
    int id, count = 0;

    if (dbe->effect) {
	id = NH_EFFECT_ID(dbe->effect);

	switch (NH_EFFECT_TYPE(dbe->effect)) {
	    case E_EXPLOSION:
		syms[0] = cur_drawing->explsyms[id % NUMEXPCHARS];
		syms[0].color = cur_drawing->expltypes[id / NUMEXPCHARS].color;
		break;

	    case E_SWALLOW:
		syms[0] = cur_drawing->swallowsyms[id & 0x7];
		syms[0].color = cur_drawing->monsters[id >> 3].color;
		break;

	    case E_ZAP:
		syms[0] = cur_drawing->zapsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_BREATH:
		syms[0] = cur_drawing->breathsyms[id & 0x3];
		syms[0].color = cur_drawing->zaptypes[id >> 2].color;
		break;

	    case E_MISC:
		syms[0] = cur_drawing->effects[id];
		syms[0].color = cur_drawing->effects[id].color;
		break;
	}

	valley_symdef(&syms[0]);

	return 1; /* we don't want to show other glyphs under effects */
    }
    
    if (dbe->invis) {
	syms[count] = cur_drawing->invis[0];
	valley_symdef(&syms[count]);
	count++;
    } else if (dbe->mon) {
	if (dbe->mon > cur_drawing->num_monsters && (dbe->monflags & MON_WARNING)) {
	    id = dbe->mon - 1 - cur_drawing->num_monsters;
	    syms[count] = cur_drawing->warnings[id];
	} else {
	    id = dbe->mon - 1;
	    syms[count] = cur_drawing->monsters[id];
	}
	valley_symdef(&syms[count]);
	count++;
    }
    
    if (dbe->obj) {
	object_symdef(dbe->obj - 1, dbe->obj_mn - 1, &syms[count]);

	if (dbe->objflags & DOBJ_PRIZE)
	    syms[count].color = CLR_BRIGHT_MAGENTA;
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	count++;
    }
    
    if (dbe->trap) {
	id = dbe->trap - 1;
	syms[count] = cur_drawing->traps[id];

	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);

	if (id == mportal_id || id == vibsquare_id)
	    *bg_color = CLR_RED;

	count++;
    } 
    
    /* omit the background symbol from the list if it is boring */
    if (count == 0 || dbe->bg >= cur_drawing->bg_feature_offset) {
	syms[count] = cur_drawing->bgelements[dbe->bg];
	recolor_bg(dbe, &syms[count]);
	valley_symdef(&syms[count]);
	if (settings.darkroom && !(dbe->dgnflags & NH_DF_VISIBLE_MASK))
	    darken_symdef(&syms[count]);
	count++;
    }

    if (dbe->bg == upstair_id  || dbe->bg == dnstair_id  ||
	dbe->bg == upladder_id || dbe->bg == dnladder_id ||
	dbe->bg == upsstair_id || dbe->bg == dnsstair_id) {
	*bg_color = CLR_RED;
    }

    /* monsters override background color, NAO-style */
    if (dbe->mon || dbe->invis)
	*bg_color = 0;

    return count; /* count <= 4 */
}